

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::CodeHolder::detach(CodeHolder *this,BaseEmitter *emitter)

{
  Error EVar1;
  uint32_t uVar2;
  BaseEmitter *emitter_local;
  
  if (emitter == (BaseEmitter *)0x0) {
    EVar1 = 2;
  }
  else if (emitter->_code == this) {
    emitter_local = emitter;
    if ((char)emitter->_emitterFlags < '\0') {
      EVar1 = 0;
    }
    else {
      EVar1 = (*emitter->_vptr_BaseEmitter[0x11])(emitter,this);
    }
    uVar2 = ZoneVector<asmjit::v1_14::BaseEmitter_*>::indexOf(&this->_emitters,&emitter_local);
    if (uVar2 == 0xffffffff) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/codeholder.cpp"
                 ,0xf3,"index != Globals::kNotFound");
    }
    ZoneVector<asmjit::v1_14::BaseEmitter_*>::removeAt(&this->_emitters,(ulong)uVar2);
    emitter_local->_code = (CodeHolder *)0x0;
  }
  else {
    EVar1 = 3;
  }
  return EVar1;
}

Assistant:

Error CodeHolder::detach(BaseEmitter* emitter) noexcept {
  if (ASMJIT_UNLIKELY(!emitter))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(emitter->_code != this))
    return DebugUtils::errored(kErrorInvalidState);

  // NOTE: We always detach if we were asked to, if error happens during
  // `emitter->onDetach()` we just propagate it, but the BaseEmitter will
  // be detached.
  Error err = kErrorOk;
  if (!emitter->isDestroyed())
    err = emitter->onDetach(this);

  // Disconnect CodeHolder <-> BaseEmitter.
  uint32_t index = _emitters.indexOf(emitter);
  ASMJIT_ASSERT(index != Globals::kNotFound);

  _emitters.removeAt(index);
  emitter->_code = nullptr;

  return err;
}